

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_rsqrt>(Mat *a,Option *opt)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  __m512 *in_RDI;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_rsqrt op;
  Mat *m;
  float *in_stack_fffffffffffffd00;
  unary_op_rsqrt *in_stack_fffffffffffffd08;
  unary_op_rsqrt *in_stack_fffffffffffffd10;
  __m512 *x;
  unary_op_rsqrt *in_stack_fffffffffffffd50;
  int local_23c;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined4 local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined1 (*local_1f0) [64];
  int local_1e8;
  int local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  unary_op_rsqrt local_1c9 [9];
  __m512 *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_190;
  undefined1 (*local_188) [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 (*local_130) [64];
  undefined1 (*local_128) [64];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 (*local_f0) [64];
  undefined1 (*local_e8) [64];
  unary_op_rsqrt *local_e0;
  undefined8 uStack_d8;
  undefined1 (*local_d0) [64];
  undefined8 local_c8;
  float local_bc;
  long local_b8;
  undefined1 (*local_b0) [64];
  float local_a4;
  float local_a0;
  float local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined8 *local_78;
  
  local_1d0 = (*in_RDI)[0xb];
  local_1d4 = (*in_RDI)[0xc];
  local_1d8 = (*in_RDI)[0xd];
  local_1dc = (*in_RDI)[0xe];
  local_1e0 = (*in_RDI)[6];
  local_1e4 = (int)local_1d0 * (int)local_1d4 * (int)local_1d8 * (int)local_1e0;
  local_1c0 = in_RDI;
  for (local_1e8 = 0; local_1e8 < (int)local_1dc; local_1e8 = local_1e8 + 1) {
    local_1a8 = &local_238;
    local_9c = (*local_1c0)[0xb];
    local_a0 = (*local_1c0)[0xc];
    local_a4 = (*local_1c0)[0xd];
    local_1f0 = (undefined1 (*) [64])
                (*(long *)*local_1c0 +
                *(long *)local_1c0[1] * (long)local_1e8 * *(long *)(*local_1c0 + 4));
    local_b8 = *(long *)(*local_1c0 + 4);
    local_bc = (*local_1c0)[6];
    local_c8 = *(undefined8 *)(*local_1c0 + 8);
    local_98 = &local_238;
    local_88 = (long)(int)local_9c * (long)(int)local_a0 * local_b8;
    local_1a0 = &local_238;
    local_190 = &local_238;
    local_8c = 0x10;
    local_1b4 = local_1e8;
    local_1b5 = 1;
    local_238 = 0;
    local_228 = 0;
    local_220 = 0;
    local_210 = 0;
    local_20c = 0;
    local_208 = 0;
    local_204 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_230 = 0;
    x = local_1c0;
    local_b0 = local_1f0;
    local_78 = local_190;
    local_218 = local_c8;
    for (local_23c = 0; local_23c + 0xf < local_1e4; local_23c = local_23c + 0x10) {
      local_188 = local_1f0;
      uVar6 = *(undefined8 *)*local_1f0;
      uVar5 = *(undefined8 *)(*local_1f0 + 8);
      uVar7 = *(undefined8 *)(*local_1f0 + 0x10);
      uVar8 = *(undefined8 *)(*local_1f0 + 0x18);
      uVar9 = *(undefined8 *)(*local_1f0 + 0x20);
      uVar10 = *(undefined8 *)(*local_1f0 + 0x28);
      uVar11 = *(undefined8 *)(*local_1f0 + 0x30);
      uVar12 = *(undefined8 *)(*local_1f0 + 0x38);
      UnaryOp_x86_avx512_functor::unary_op_rsqrt::func_pack16(in_stack_fffffffffffffd50,x);
      local_130 = local_1f0;
      auVar1._8_8_ = uVar5;
      auVar1._0_8_ = uVar6;
      auVar1._16_8_ = uVar7;
      auVar1._24_8_ = uVar8;
      auVar1._32_8_ = uVar9;
      auVar1._40_8_ = uVar10;
      auVar1._48_8_ = uVar11;
      auVar1._56_8_ = uVar12;
      *local_1f0 = auVar1;
      local_1f0 = local_1f0 + 1;
      local_180 = uVar6;
      uStack_178 = uVar5;
      uStack_170 = uVar7;
      uStack_168 = uVar8;
      uStack_160 = uVar9;
      uStack_158 = uVar10;
      uStack_150 = uVar11;
      uStack_148 = uVar12;
    }
    for (; local_23c + 7 < local_1e4; local_23c = local_23c + 8) {
      local_128 = local_1f0;
      uVar6 = *(undefined8 *)*local_1f0;
      uVar5 = *(undefined8 *)(*local_1f0 + 8);
      uVar7 = *(undefined8 *)(*local_1f0 + 0x10);
      uVar8 = *(undefined8 *)(*local_1f0 + 0x18);
      UnaryOp_x86_avx512_functor::unary_op_rsqrt::func_pack8
                (in_stack_fffffffffffffd10,(__m256 *)in_stack_fffffffffffffd08);
      local_f0 = local_1f0;
      auVar2._8_8_ = uVar5;
      auVar2._0_8_ = uVar6;
      auVar2._16_8_ = uVar7;
      auVar2._24_8_ = uVar8;
      *(undefined1 (*) [32])*local_1f0 = auVar2;
      local_1f0 = (undefined1 (*) [64])(*local_1f0 + 0x20);
      local_120 = uVar6;
      uStack_118 = uVar5;
      uStack_110 = uVar7;
      uStack_108 = uVar8;
    }
    for (; local_23c + 3 < local_1e4; local_23c = local_23c + 4) {
      local_e8 = local_1f0;
      uVar6 = *(undefined8 *)(*local_1f0 + 8);
      afVar13 = UnaryOp_x86_avx512_functor::unary_op_rsqrt::func_pack4
                          (local_1c9,(__m128 *)&stack0xfffffffffffffd50);
      in_stack_fffffffffffffd50 = afVar13._0_8_;
      local_d0 = local_1f0;
      auVar3._8_8_ = uVar6;
      auVar3._0_8_ = in_stack_fffffffffffffd50;
      *(undefined1 (*) [16])*local_1f0 = auVar3;
      local_1f0 = (undefined1 (*) [64])(*local_1f0 + 0x10);
      local_e0 = in_stack_fffffffffffffd50;
      uStack_d8 = uVar6;
    }
    for (; local_23c < local_1e4; local_23c = local_23c + 1) {
      fVar4 = UnaryOp_x86_avx512_functor::unary_op_rsqrt::func
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      *(float *)*local_1f0 = fVar4;
      local_1f0 = (undefined1 (*) [64])(*local_1f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}